

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconstraintForceModifier.cpp
# Opt level: O2

bool __thiscall
OpenMD::ZConstraintForceModifier::isZMol(ZConstraintForceModifier *this,Molecule *mol)

{
  iterator iVar1;
  int local_c;
  
  local_c = mol->globalIndex_;
  iVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_OpenMD::ZconstraintParam>,_std::_Select1st<std::pair<const_int,_OpenMD::ZconstraintParam>_>,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::ZconstraintParam>_>_>
          ::find(&(this->allZMolIndices_)._M_t,&local_c);
  return (_Rb_tree_header *)iVar1._M_node !=
         &(this->allZMolIndices_)._M_t._M_impl.super__Rb_tree_header;
}

Assistant:

bool ZConstraintForceModifier::isZMol(Molecule* mol) {
    return allZMolIndices_.find(mol->getGlobalIndex()) ==
                   allZMolIndices_.end() ?
               false :
               true;
  }